

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestVC.cxx
# Opt level: O3

string * cmCTestVC::ComputeCommandLine
                   (string *__return_storage_ptr__,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *cmd)

{
  pointer pbVar1;
  size_t sVar2;
  ostream *poVar3;
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg;
  pointer pbVar4;
  ostringstream line;
  undefined1 local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  pbVar4 = (cmd->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (cmd->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar4 != pbVar1) {
    __s = "";
    do {
      sVar2 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s,sVar2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\"",1);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,(pbVar4->_M_dataplus)._M_p,pbVar4->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\"",1);
      pbVar4 = pbVar4 + 1;
      __s = " ";
    } while (pbVar4 != pbVar1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

std::string cmCTestVC::ComputeCommandLine(const std::vector<std::string>& cmd)
{
  std::ostringstream line;
  const char* sep = "";
  for (auto const& arg : cmd) {
    line << sep << "\"" << arg << "\"";
    sep = " ";
  }
  return line.str();
}